

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

chunk_conflict * mtntop_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  loc_conflict to_avoid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc grid1;
  loc grid1_00;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc_conflict grid_06;
  loc_conflict grid_07;
  loc_conflict grid_08;
  loc_conflict grid_09;
  loc grid_10;
  loc_conflict grid_11;
  loc_conflict grid_12;
  loc_conflict grid_13;
  loc_conflict grid_14;
  loc_conflict grid_15;
  loc_conflict grid_16;
  loc_conflict grid_17;
  loc_conflict grid_18;
  loc_conflict grid_19;
  loc_conflict grid_20;
  _Bool _Var1;
  int16_t iVar2;
  uint32_t uVar3;
  chunk *c_00;
  loc_conflict lVar9;
  uint32_t uVar4;
  wchar_t wVar5;
  int iVar6;
  int A;
  int iVar7;
  int iVar8;
  feature *pfVar10;
  loc lVar11;
  loc lVar12;
  chunk_conflict *c;
  uint32_t local_50;
  _Bool placed;
  wchar_t floors;
  wchar_t spot;
  wchar_t b;
  wchar_t a;
  wchar_t plats;
  wchar_t k;
  wchar_t j;
  wchar_t i;
  loc top;
  loc grid;
  char **p_error_local;
  wchar_t width_local;
  wchar_t height_local;
  player *p_local;
  
  local_50 = 0;
  c._7_1_ = false;
  c_00 = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c_00->depth = (int)p->depth;
  c_00->place = (int)p->place;
  for (top.y = 0; top.y < c_00->height; top.y = top.y + 1) {
    for (top.x = 0; top.x < c_00->width; top.x = top.x + 1) {
      lVar9.y = top.y;
      lVar9.x = top.x;
      square_set_feat(c_00,lVar9,FEAT_VOID);
    }
  }
  set_num_vaults((chunk_conflict *)c_00);
  make_edges((chunk_conflict *)c_00,false,false);
  while (((c._7_1_ ^ 0xffU) & 1) != 0) {
    uVar3 = Rand_div(6);
    spot = uVar3 + L'\x04';
    uVar3 = Rand_div(5);
    floors = uVar3 + L'\x04';
    i = c_00->height / 2;
    j = c_00->width / 2;
    c._7_1_ = generate_starburst_room
                        ((chunk_conflict *)c_00,i - floors,j - spot,i + floors,j + spot,false,
                         FEAT_ROAD,false);
  }
  grid_00.y = i;
  grid_00.x = j;
  square_set_feat(c_00,grid_00,FEAT_GRANITE);
  grid_01.y = i;
  grid_01.x = j;
  square_mark(c_00,grid_01);
  for (k = L'\0'; k < L'\b'; k = k + L'\x01') {
    lVar11.y = i;
    lVar11.x = j;
    lVar9 = (loc_conflict)loc_sum(lVar11,ddgrid[k]);
    square_set_feat(c_00,lVar9,FEAT_GRANITE);
    lVar12.y = i;
    lVar12.x = j;
    lVar9 = (loc_conflict)loc_sum(lVar12,ddgrid[k]);
    square_mark(c_00,lVar9);
  }
  for (top.y = i - floors; top.y < i + floors; top.y = top.y + 1) {
    for (top.x = j - spot; top.x < j + spot; top.x = top.x + 1) {
      grid_02.y = top.y;
      grid_02.x = top.x;
      pfVar10 = square_feat(c_00,grid_02);
      if (pfVar10->fidx == FEAT_ROAD) {
        local_50 = local_50 + 1;
      }
    }
  }
  uVar3 = Rand_div(local_50);
  uVar4 = Rand_div(2);
  if (uVar4 == 0) {
    wVar5 = rand_range(i - floors,i + floors);
    grid_03.y = wVar5;
    grid_03.x = top.x;
    pfVar10 = square_feat(c_00,grid_03);
    if (pfVar10->fidx != FEAT_VOID) {
      uVar4 = Rand_div(2);
      iVar6 = -1;
      if (uVar4 == 0) {
        iVar6 = 1;
      }
      top.x = j;
      while ((top.x != j + iVar6 * (spot + L'\x01') &&
             (grid_04.y = wVar5, grid_04.x = top.x, pfVar10 = square_feat(c_00,grid_04),
             pfVar10->fidx != FEAT_VOID))) {
        top.x = iVar6 + top.x;
      }
      grid_05.y = wVar5;
      grid_05.x = top.x;
      square_set_feat(c_00,grid_05,FEAT_MORE);
    }
  }
  for (top.y = i - floors; top.y < i + floors; top.y = top.y + 1) {
    for (top.x = j - spot; top.x < j + spot; top.x = top.x + 1) {
      grid_06.y = top.y;
      grid_06.x = top.x;
      pfVar10 = square_feat(c_00,grid_06);
      if (((pfVar10->fidx != FEAT_VOID) &&
          (grid_07.y = top.y, grid_07.x = top.x, pfVar10 = square_feat(c_00,grid_07),
          pfVar10->fidx != FEAT_GRANITE)) &&
         (grid_08.y = top.y, grid_08.x = top.x, pfVar10 = square_feat(c_00,grid_08),
         pfVar10->fidx != FEAT_MORE)) {
        grid_09.y = top.y;
        grid_09.x = top.x;
        pfVar10 = square_feat(c_00,grid_09);
        if ((pfVar10->fidx == FEAT_ROAD) && (local_50 = local_50 - 1, local_50 == uVar3)) {
          grid_10.y = top.y;
          grid_10.x = top.x;
          player_place((chunk_conflict1 *)c_00,p,grid_10);
          grid_11.y = top.y;
          grid_11.x = top.x;
          square_mark(c_00,grid_11);
        }
        else {
          uVar4 = Rand_div(5);
          if (uVar4 == 0) {
            grid_12.y = top.y;
            grid_12.x = top.x;
            square_set_feat(c_00,grid_12,FEAT_GRANITE);
          }
          else {
            uVar4 = Rand_div(8);
            if (uVar4 == 0) {
              grid_13.y = top.y;
              grid_13.x = top.x;
              square_set_feat(c_00,grid_13,FEAT_PASS_RUBBLE);
            }
            else {
              uVar4 = Rand_div(0x14);
              if (uVar4 == 0) {
                grid_14.y = top.y;
                grid_14.x = top.x;
                square_set_feat(c_00,grid_14,FEAT_TREE2);
              }
            }
          }
        }
      }
    }
  }
  b = Rand_div(4);
  for (plats = L'\0'; plats < L'\n'; plats = plats + L'\x01') {
    uVar3 = Rand_div(6);
    iVar6 = uVar3 + 4;
    uVar3 = Rand_div(5);
    A = uVar3 + 4;
    iVar7 = rand_range(A,(c_00->height + L'\xffffffff') - A);
    iVar8 = rand_range(iVar6,(c_00->width + L'\xffffffff') - iVar6);
    lVar11 = loc(-iVar6,-A);
    grid1.y = iVar7;
    grid1.x = iVar8;
    lVar11 = loc_sum(grid1,lVar11);
    lVar12 = loc(iVar6,A);
    grid1_00.y = iVar7;
    grid1_00.x = iVar8;
    lVar12 = loc_sum(grid1_00,lVar12);
    _Var1 = check_clearing_space((chunk_conflict *)c_00,lVar11,lVar12);
    if ((_Var1) &&
       (_Var1 = generate_starburst_room
                          ((chunk_conflict *)c_00,iVar7 - A,iVar8 - iVar6,iVar7 + A,iVar8 + iVar6,
                           false,FEAT_ROAD,false), _Var1)) {
      b = b + L'\xffffffff';
      for (top.y = iVar7 - A; top.y < iVar7 + A; top.y = top.y + 1) {
        for (top.x = iVar8 - iVar6; top.x < iVar8 + iVar6; top.x = top.x + 1) {
          grid_15.y = top.y;
          grid_15.x = top.x;
          pfVar10 = square_feat(c_00,grid_15);
          if (pfVar10->fidx != FEAT_VOID) {
            uVar3 = Rand_div(5);
            if (uVar3 == 0) {
              grid_16.y = top.y;
              grid_16.x = top.x;
              square_set_feat(c_00,grid_16,FEAT_GRANITE);
            }
            else {
              uVar3 = Rand_div(8);
              if (uVar3 == 0) {
                grid_17.y = top.y;
                grid_17.x = top.x;
                square_set_feat(c_00,grid_17,FEAT_PASS_RUBBLE);
              }
              else {
                uVar3 = Rand_div(0x14);
                if (uVar3 == 0) {
                  grid_18.y = top.y;
                  grid_18.x = top.x;
                  square_set_feat(c_00,grid_18,FEAT_TREE2);
                }
              }
            }
          }
        }
      }
      if (b == L'\0') break;
    }
  }
  for (top.y = 0; top.y < c_00->height; top.y = top.y + 1) {
    for (top.x = 0; top.x < c_00->width; top.x = top.x + 1) {
      grid_19.y = top.y;
      grid_19.x = top.x;
      square_unmark(c_00,grid_19);
      if ((((top.y == 0) || (top.x == 0)) || (top.y == c_00->height + L'\xffffffff')) ||
         (top.x == c_00->width + L'\xffffffff')) {
        grid_20.y = top.y;
        grid_20.x = top.x;
        square_set_feat(c_00,grid_20,FEAT_PERM);
      }
    }
  }
  plats = c_00->depth;
  get_mon_num(c_00->depth,c_00->depth);
  for (; L'\0' < plats; plats = plats + L'\xffffffff') {
    to_avoid.x = (player->grid).x;
    to_avoid.y = (player->grid).y;
    pick_and_place_distant_monster(c_00,to_avoid,L'\n',true,c_00->depth);
  }
  iVar2 = Rand_normal((uint)z_info->both_item_av,3);
  alloc_objects((chunk_conflict *)c_00,L'\x03',L'\x03',(int)iVar2,c_00->depth,'\x01');
  return (chunk_conflict *)c_00;
}

Assistant:

struct chunk *mtntop_gen(struct player *p, int height, int width,
						 const char **p_error)
{
	struct loc grid, top;
	int i, j, k;
	int plats, a, b;
	int spot, floors = 0;
	bool placed = false;

	/* Make the level */
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;

	/* Start with void */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create void */
			square_set_feat(c, grid, FEAT_VOID);
		}
	}

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, false, false);

	/* Make the main mountaintop */
	while (!placed) {
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		top.y = c->height / 2;
		top.x = c->width / 2;
		placed = generate_starburst_room(c, top.y - b, top.x - a, top.y + b,
										 top.x + a, false, FEAT_ROAD, false);
	}

	/* Summit */
	square_set_feat(c, top, FEAT_GRANITE);
	square_mark(c, top);
	for (i = 0; i < 8; i++) {
		square_set_feat(c, loc_sum(top, ddgrid[i]), FEAT_GRANITE);
		square_mark(c, loc_sum(top, ddgrid[i]));
	}

	/* Count the floors */
	for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
		for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				floors++;
			}
		}
	}

	/* Choose the player place */
	spot = randint0(floors);

	/* Can we get down? */
	if (one_in_(2)) {
		grid.y = rand_range(top.y - b, top.y + b);
		if (square_feat(c, grid)->fidx != FEAT_VOID) {
			i = one_in_(2) ? 1 : -1;
			for (grid.x = top.x; grid.x != (top.x + i * (a + 1)); grid.x += i) {
				if (square_feat(c, grid)->fidx == FEAT_VOID) break;
			}
			square_set_feat(c, grid, FEAT_MORE);
		}
	}

	/* Adjust the terrain, place the player */
	for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
		for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
			/* Only change generated stuff */
			if (square_feat(c, grid)->fidx == FEAT_VOID)
				continue;

			/* Leave rock */
			if (square_feat(c, grid)->fidx == FEAT_GRANITE)
				continue;

			/* Leave stair */
			if (square_feat(c, grid)->fidx == FEAT_MORE)
				continue;

			/* Place the player? */
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				floors--;
				if (floors == spot) {
					player_place(c, p, grid);
					square_mark(c, grid);
					continue;
				}
			}

			/* Place some rock */
			if (one_in_(5)) {
				square_set_feat(c, grid, FEAT_GRANITE);
				continue;
			}

			/* rubble */
			if (one_in_(8)) {
				square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				continue;
			}

			/* and the odd tree */
			if (one_in_(20)) {
				square_set_feat(c, grid, FEAT_TREE2);
				continue;
			}
		}
	}

	/* Make a few "plateaux" */
	plats = randint0(4);

	/* Try fairly hard */
	for (j = 0; j < 10; j++) {
		/* Try for a plateau */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		top.y = rand_range(b, c->height - 1 - b);
		top.x = rand_range(a, c->width - 1 - a);
		if (!check_clearing_space(c, loc_sum(top, loc(-a, -b)),
				loc_sum(top, loc(a, b)))
				|| !generate_starburst_room(c, top.y - b,
				top.x - a, top.y + b, top.x + a, false,
				FEAT_ROAD, false)) continue;

		/* Success */
		plats--;

		/* Adjust the terrain a bit */
		for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
			for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
				/* Only change generated stuff */
				if (square_feat(c, grid)->fidx == FEAT_VOID)
					continue;

				/* Place some rock */
				if (one_in_(5)) {
					square_set_feat(c, grid, FEAT_GRANITE);
					continue;
				}

				/* rubble */
				if (one_in_(8)) {
					square_set_feat(c, grid, FEAT_PASS_RUBBLE);
					continue;
				}

				/* and the odd tree */
				if (one_in_(20)) {
					square_set_feat(c, grid, FEAT_TREE2);
					continue;
				}
			}
		}

		/* Done ? */
		if (!plats)
			break;
	}


	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);

			/* Paranoia - remake the dungeon walls */
			if ((grid.y == 0) || (grid.x == 0) ||
				(grid.y == c->height - 1) || (grid.x == c->width - 1)) {
				square_set_feat(c, grid, FEAT_PERM);
			}
		}
	}

	/* Basic "amount" */
	k = c->depth;

	/* Build the monster probability table. */
	(void) get_mon_num(c->depth, c->depth);

	/* Put some monsters in the dungeon */
	for (j = k; j > 0; j--) {
		(void) pick_and_place_distant_monster(c, player->grid, 10, true,
											  c->depth);
	}


	/* Put some objects in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->both_item_av, 3),
				 c->depth, ORIGIN_FLOOR);


	return c;
}